

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O0

bool __thiscall
tchecker::tck_reach::concur19::node_le_t::operator()(node_le_t *this,node_t *n1,node_t *n2)

{
  bool bVar1;
  element_type *this_00;
  state_t *psVar2;
  vloc_t *vloc;
  state_t *s2;
  node_t *n2_local;
  node_t *n1_local;
  node_le_t *this_local;
  
  this_00 = std::
            __shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  psVar2 = tchecker::graph::node_refzg_state_t::state(&n2->super_node_refzg_state_t);
  vloc = syncprod::state_t::vloc((state_t *)psVar2);
  clockbounds::clockbounds_t::local_lu(this_00,vloc,this->_l,this->_u);
  psVar2 = tchecker::graph::node_refzg_state_t::state(&n1->super_node_refzg_state_t);
  s2 = tchecker::graph::node_refzg_state_t::state(&n2->super_node_refzg_state_t);
  bVar1 = refzg::shared_is_sync_alu_le(psVar2,s2,this->_l,this->_u);
  return bVar1;
}

Assistant:

bool node_le_t::operator()(tchecker::tck_reach::concur19::node_t const & n1,
                           tchecker::tck_reach::concur19::node_t const & n2) const
{
  _clockbounds->local_lu(n2.state().vloc(), *_l, *_u);
  return tchecker::refzg::shared_is_sync_alu_le(n1.state(), n2.state(), *_l, *_u);
}